

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
Filter::predict(vector<float,_std::allocator<float>_> *__return_storage_ptr__,Filter *this)

{
  double dVar1;
  double dVar2;
  long lVar3;
  float *pfVar4;
  Mat *pMVar5;
  int i;
  int i0;
  float fVar6;
  Mat estimated;
  
  dVar1 = this->ticks;
  lVar3 = cv::getTickCount();
  this->ticks = (double)lVar3;
  dVar2 = (double)cv::getTickFrequency();
  fVar6 = (float)(((double)lVar3 - dVar1) / dVar2);
  pMVar5 = &(this->KF).transitionMatrix;
  pfVar4 = cv::Mat::at<float>(pMVar5,2);
  *pfVar4 = fVar6;
  pfVar4 = cv::Mat::at<float>(pMVar5,7);
  *pfVar4 = fVar6;
  cv::Mat::Mat(&estimated);
  cv::KalmanFilter::predict(&(this->KF).statePre);
  cv::Mat::~Mat(&estimated);
  pMVar5 = (Mat *)cv::KalmanFilter::correct(&(this->KF).statePre);
  cv::Mat::Mat(&estimated,pMVar5);
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (i0 = 0; i0 < this->stateSize; i0 = i0 + 1) {
    pfVar4 = cv::Mat::at<float>(&estimated,i0);
    std::vector<float,std::allocator<float>>::emplace_back<float&>
              ((vector<float,std::allocator<float>> *)__return_storage_ptr__,pfVar4);
  }
  cv::Mat::~Mat(&estimated);
  return __return_storage_ptr__;
}

Assistant:

vector<float> Filter::predict() {
    double precTick = ticks;
    ticks = (double) getTickCount();
    double dT = (ticks - precTick) / getTickFrequency();

    KF.transitionMatrix.at<float>(2) = dT;
    KF.transitionMatrix.at<float>(7) = dT;
    KF.predict();
    Mat estimated = KF.correct(meas);
    vector<float> res;
    for (int i = 0; i < stateSize; i++) {
        res.emplace_back(estimated.at<float>(i));
    }
    return res;
}